

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O2

jieba_token_t * convert_tokens(vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  long lVar1;
  jieba_token_t *pjVar2;
  uint32_t *puVar3;
  long lVar4;
  bool bVar5;
  value_type word;
  
  lVar1 = ((long)(words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl
                .super__Vector_impl_data._M_start) / 0x30;
  pjVar2 = (jieba_token_t *)malloc(lVar1 * 0x18 + 0x18);
  puVar3 = &pjVar2->unicode_offset;
  lVar4 = 0;
  while (bVar5 = lVar1 != 0, lVar1 = lVar1 + -1, bVar5) {
    cppjieba::Word::Word
              (&word,(Word *)((long)&(((words->
                                       super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->word).
                                     _M_dataplus._M_p + lVar4));
    ((jieba_token_t *)(puVar3 + -4))->offset = word.offset;
    *(size_type *)(puVar3 + -2) = word.word._M_string_length;
    *(undefined8 *)puVar3 = word._36_8_;
    std::__cxx11::string::~string((string *)&word);
    lVar4 = lVar4 + 0x30;
    puVar3 = puVar3 + 6;
  }
  lVar1 = ((long)(words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl
                .super__Vector_impl_data._M_start) / 0x30;
  pjVar2[lVar1].offset = 0;
  pjVar2[lVar1].length = 0;
  (&pjVar2[lVar1].length)[1] = 0;
  return pjVar2;
}

Assistant:

static jieba_token_t* convert_tokens(const std::vector<cppjieba::Word>& words) {
    size_t len = words.size();
    jieba_token_t* res = static_cast<jieba_token_t*>(malloc(sizeof(jieba_token_t) * (len + 1)));
    for (size_t i = 0; i < len; i++) {
      auto word = words[i];
      res[i].offset = word.offset;
      res[i].length = word.word.size();
      res[i].unicode_offset = word.unicode_offset;
      res[i].unicode_length = word.unicode_length;
    }
    res[words.size()].offset = 0;
    res[words.size()].length = 0;
    res[words.size()].unicode_offset = 0;
    res[words.size()].unicode_length = 0;
    return res;
}